

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample
          (SampleVerifier *this,IVec3 *texelBase,Vec3 *weights,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  float weight;
  undefined1 local_38 [16];
  Vec4 *resultMin_local;
  int level_local;
  int layer_local;
  Vec3 *weights_local;
  IVec3 *texelBase_local;
  SampleVerifier *this_local;
  
  local_38._8_8_ = resultMin;
  resultMin_local._0_4_ = level;
  resultMin_local._4_4_ = layer;
  _level_local = weights;
  weights_local = (Vec3 *)texelBase;
  texelBase_local = (IVec3 *)this;
  if (this->m_imParams->dim == IMG_DIM_1D) {
    weight = tcu::Vector<float,_3>::x(weights);
    getFilteredSample1D(this,texelBase,weight,resultMin_local._4_4_,(int)resultMin_local,
                        (Vec4 *)local_38._8_8_,resultMax);
  }
  else if ((this->m_imParams->dim == IMG_DIM_2D) || (this->m_imParams->dim == IMG_DIM_CUBE)) {
    tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_38,(int)weights,0);
    getFilteredSample2D(this,texelBase,(Vec2 *)local_38,resultMin_local._4_4_,(int)resultMin_local,
                        (Vec4 *)local_38._8_8_,resultMax);
  }
  else {
    getFilteredSample3D(this,texelBase,weights,layer,level,resultMin,resultMax);
  }
  return;
}

Assistant:

void SampleVerifier::getFilteredSample (const IVec3&	texelBase,
										const Vec3&		weights,
										int				layer,
										int				level,
										Vec4&			resultMin,
										Vec4&			resultMax) const
{
	DE_ASSERT(layer < m_imParams.arrayLayers);
	DE_ASSERT(level < m_imParams.levels);

	if (m_imParams.dim == IMG_DIM_1D)
	{
		getFilteredSample1D(texelBase, weights.x(), layer, level, resultMin, resultMax);
	}
	else if (m_imParams.dim == IMG_DIM_2D || m_imParams.dim == IMG_DIM_CUBE)
	{
		getFilteredSample2D(texelBase, weights.swizzle(0, 1), layer, level, resultMin, resultMax);
	}
	else
	{
		getFilteredSample3D(texelBase, weights, layer, level, resultMin, resultMax);
	}
}